

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

os_specfile_t os_is_special_file(char *fname)

{
  int iVar1;
  char *in_RDI;
  char parentWithSep [4];
  char selfWithSep [3];
  char local_17 [7];
  char *local_10;
  
  local_17[4] = '.';
  local_17[5] = '/';
  local_17[6] = 0;
  builtin_strncpy(local_17,"../",4);
  local_10 = in_RDI;
  iVar1 = strcmp(in_RDI,".");
  if ((iVar1 == 0) || (iVar1 = strcmp(local_10,local_17 + 4), iVar1 == 0)) {
    return OS_SPECFILE_SELF;
  }
  iVar1 = strcmp(local_10,"..");
  if ((iVar1 != 0) && (iVar1 = strcmp(local_10,local_17), iVar1 != 0)) {
    return OS_SPECFILE_NONE;
  }
  return OS_SPECFILE_PARENT;
}

Assistant:

os_specfile_t
os_is_special_file( const char* fname )
{
    // We also check for "./" and "../" instead of just "." and
    // "..".  (We use OSPATHCHAR instead of '/' though.)
    const char selfWithSep[3] = {'.', OSPATHCHAR, '\0'};
    const char parentWithSep[4] = {'.', '.', OSPATHCHAR, '\0'};
    if ((strcmp(fname, ".") == 0) or (strcmp(fname, selfWithSep) == 0)) return OS_SPECFILE_SELF;
    if ((strcmp(fname, "..") == 0) or (strcmp(fname, parentWithSep) == 0)) return OS_SPECFILE_PARENT;
    return OS_SPECFILE_NONE;
}